

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.hpp
# Opt level: O1

void __thiscall OpenMD::AtomType::addZig(AtomType *this,AtomType *at)

{
  pointer *pppAVar1;
  iterator __position;
  AtomType *local_8;
  
  __position._M_current =
       (this->everyZIG).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->everyZIG).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = at;
    std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>::
    _M_realloc_insert<OpenMD::AtomType*const&>
              ((vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>> *)&this->everyZIG,
               __position,&local_8);
  }
  else {
    *__position._M_current = at;
    pppAVar1 = &(this->everyZIG).
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

void addZig(AtomType* at) { everyZIG.push_back(at); }